

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O3

void * Res_SatSimulateConstr(Abc_Ntk_t *pAig,int fOnSet)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  Abc_Obj_t **ppNodes;
  Vec_Ptr_t *__ptr;
  Abc_Obj_t *pAVar6;
  ulong uVar7;
  ulong uVar8;
  sat_solver *s;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  lit Lit;
  lit Lit_1;
  lit Lit_2;
  int local_3c;
  int local_38;
  int local_34;
  
  ppNodes = (Abc_Obj_t **)malloc(0x40);
  pVVar9 = pAig->vPos;
  iVar1 = pVVar9->nSize;
  if ((0 < iVar1) && (*ppNodes = (Abc_Obj_t *)*pVVar9->pArray, iVar1 != 1)) {
    ppNodes[1] = (Abc_Obj_t *)pVVar9->pArray[1];
    __ptr = Abc_NtkDfsNodes(pAig,ppNodes,2);
    pAVar6 = Abc_AigConst1(pAig);
    (pAVar6->field_6).pTemp = (void *)0x0;
    pVVar9 = pAig->vPis;
    if (pVVar9->nSize < 1) {
      uVar8 = 1;
    }
    else {
      uVar7 = 1;
      do {
        *(ulong *)((long)pVVar9->pArray[uVar7 - 1] + 0x40) = uVar7;
        uVar8 = uVar7 + 1;
        pVVar9 = pAig->vPis;
        bVar4 = (long)uVar7 < (long)pVVar9->nSize;
        uVar7 = uVar8;
      } while (bVar4);
    }
    uVar5 = (uint)uVar8;
    if (0 < __ptr->nSize) {
      lVar10 = 0;
      do {
        *(ulong *)((long)__ptr->pArray[lVar10] + 0x40) = (uVar8 & 0xffffffff) + lVar10;
        lVar10 = lVar10 + 1;
      } while (lVar10 < __ptr->nSize);
      uVar5 = uVar5 + (int)lVar10;
    }
    ((*ppNodes)->field_6).pCopy = (Abc_Obj_t *)(ulong)uVar5;
    (ppNodes[1]->field_6).pTemp = (void *)((long)&((Abc_Obj_t *)(ulong)uVar5)->pNtk + 1);
    s = sat_solver_new();
    pAVar6 = Abc_AigConst1(pAig);
    local_3c = (pAVar6->field_6).iTemp * 2;
    sat_solver_addclause(s,&local_3c,&local_38);
    if (0 < __ptr->nSize) {
      lVar10 = 0;
      do {
        plVar2 = (long *)__ptr->pArray[lVar10];
        lVar3 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        Res_SatAddAnd(s,(int)plVar2[8],
                      *(int *)(*(long *)(lVar3 + (long)*(int *)plVar2[4] * 8) + 0x40),
                      *(int *)(*(long *)(lVar3 + (long)((int *)plVar2[4])[1] * 8) + 0x40),
                      *(uint *)((long)plVar2 + 0x14) >> 10 & 1,
                      *(uint *)((long)plVar2 + 0x14) >> 0xb & 1);
        lVar10 = lVar10 + 1;
      } while (lVar10 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    if (0 < pAig->vPos->nSize) {
      plVar2 = (long *)*pAig->vPos->pArray;
      Res_SatAddEqual(s,(int)plVar2[8],
                      *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                        (long)*(int *)plVar2[4] * 8) + 0x40),
                      *(uint *)((long)plVar2 + 0x14) >> 10 & 1);
      if (1 < pAig->vPos->nSize) {
        plVar2 = (long *)pAig->vPos->pArray[1];
        Res_SatAddEqual(s,(int)plVar2[8],
                        *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                          (long)*(int *)plVar2[4] * 8) + 0x40),
                        *(uint *)((long)plVar2 + 0x14) >> 10 & 1);
        if (0 < pAig->vPos->nSize) {
          local_38 = *(int *)((long)*pAig->vPos->pArray + 0x40) * 2;
          sat_solver_addclause(s,&local_38,&local_34);
          if (1 < pAig->vPos->nSize) {
            local_34 = (uint)(fOnSet == 0) + *(int *)((long)pAig->vPos->pArray[1] + 0x40) * 2;
            sat_solver_addclause(s,&local_34,(lit *)&stack0xffffffffffffffd0);
            free(ppNodes);
            return s;
          }
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void * Res_SatSimulateConstr( Abc_Ntk_t * pAig, int fOnSet )
{
    sat_solver * pSat;
    Vec_Ptr_t * vFanins;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i, nNodes;

    // start the array
    vFanins = Vec_PtrAlloc( 2 );
    pObj = Abc_NtkPo( pAig, 0 );
    Vec_PtrPush( vFanins, pObj );
    pObj = Abc_NtkPo( pAig, 1 );
    Vec_PtrPush( vFanins, pObj );

    // collect reachable nodes
    vNodes = Abc_NtkDfsNodes( pAig, (Abc_Obj_t **)vFanins->pArray, vFanins->nSize );

    // assign unique numbers to each node
    nNodes = 0;
    Abc_AigConst1(pAig)->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Abc_NtkForEachPi( pAig, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i ) // useful POs
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;

    // start the solver
    pSat = sat_solver_new();

    // add clause for the constant node
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)Abc_AigConst1(pAig)->pCopy, 0 );
    // add clauses for AND gates
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Res_SatAddAnd( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
            (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, (int)(ABC_PTRUINT_T)Abc_ObjFanin1(pObj)->pCopy, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    Vec_PtrFree( vNodes );
    // add clauses for the first PO
    pObj = Abc_NtkPo( pAig, 0 );
    Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
        (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, Abc_ObjFaninC0(pObj) );
    // add clauses for the second PO
    pObj = Abc_NtkPo( pAig, 1 );
    Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
        (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, Abc_ObjFaninC0(pObj) );

    // add trivial clauses
    pObj = Abc_NtkPo( pAig, 0 );
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 0 ); // care-set

    pObj = Abc_NtkPo( pAig, 1 );
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, !fOnSet ); // on-set

    Vec_PtrFree( vFanins );
    return pSat;
}